

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QFormLayoutItem_*>::reallocateAndGrow
          (QArrayDataPointer<QFormLayoutItem_*> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QFormLayoutItem_*> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<QFormLayoutItem_*> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QFormLayoutItem_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QFormLayoutItem_*> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QArrayDataPointer<QFormLayoutItem_*> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QFormLayoutItem_*> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) || (bVar2 = needsDetach(in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QFormLayoutItem_*> *)&DAT_aaaaaaaaaaaaaaaa,-0x5555555555555556,
                 0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QFormLayoutItem_*> *)
                  operator->((QArrayDataPointer<QFormLayoutItem_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QFormLayoutItem_*> *)0x4bc52c);
        begin((QArrayDataPointer<QFormLayoutItem_*> *)0x4bc53b);
        QtPrivate::QPodArrayOps<QFormLayoutItem_*>::copyAppend
                  (this_00,(QFormLayoutItem **)in_stack_ffffffffffffff88,
                   (QFormLayoutItem **)in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QArrayDataPointer<QFormLayoutItem_*> *)
             operator->((QArrayDataPointer<QFormLayoutItem_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QFormLayoutItem_*> *)0x4bc574);
        begin((QArrayDataPointer<QFormLayoutItem_*> *)0x4bc583);
        QtPrivate::QPodArrayOps<QFormLayoutItem_*>::moveAppend
                  ((QPodArrayOps<QFormLayoutItem_*> *)in_stack_ffffffffffffff80,
                   (QFormLayoutItem **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                   ,(QFormLayoutItem **)0x4bc5a1);
      }
    }
    swap(in_stack_ffffffffffffff80,
         (QArrayDataPointer<QFormLayoutItem_*> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff80,
           (QArrayDataPointer<QFormLayoutItem_*> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff80);
    freeSpaceAtEnd(in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<QFormLayoutItem_*>::reallocate
              ((QPodArrayOps<QFormLayoutItem_*> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }